

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeGeneratorFunctionPrototype
               (DynamicObject *generatorFunctionPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *pJVar1;
  ScriptContext *pSVar2;
  StaticType *type;
  LiteralString *pLVar3;
  
  DeferredTypeHandlerBase::Convert(typeHandler,generatorFunctionPrototype,mode,3,0);
  pJVar1 = (((generatorFunctionPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar2 = (pJVar1->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(generatorFunctionPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (generatorFunctionPrototype,0x67,
             (pJVar1->super_JavascriptLibraryBase).generatorFunctionConstructor.ptr,2,0,0,0);
  (*(generatorFunctionPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (generatorFunctionPrototype,0x124,
             (pJVar1->super_JavascriptLibraryBase).generatorPrototype.ptr,2,0,0,0);
  if (((pSVar2->config).threadConfig)->m_ES6ToStringTag == true) {
    type = StringCache::GetStringTypeStatic(&pJVar1->stringCache);
    pLVar3 = LiteralString::New(type,L"GeneratorFunction",0x11,pJVar1->recycler);
    (*(generatorFunctionPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (generatorFunctionPrototype,0x1b,pLVar3,2,0,0,0);
  }
  DynamicObject::SetHasNoEnumerableProperties(generatorFunctionPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeGeneratorFunctionPrototype(DynamicObject* generatorFunctionPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(generatorFunctionPrototype, mode, 3);
        JavascriptLibrary* library = generatorFunctionPrototype->GetLibrary();
        ScriptContext* scriptContext = library->GetScriptContext();

        library->AddMember(generatorFunctionPrototype, PropertyIds::constructor, library->generatorFunctionConstructor, PropertyConfigurable);
        library->AddMember(generatorFunctionPrototype, PropertyIds::prototype, library->generatorPrototype, PropertyConfigurable);
        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(generatorFunctionPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("GeneratorFunction")), PropertyConfigurable);
        }
        generatorFunctionPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }